

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O0

bool vkt::geometry::anon_unknown_0::verifyEmptyImage(TestLog *log,ConstPixelBufferAccess *image)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  MessageBuilder *pMVar4;
  TestLog *pTVar5;
  MessageBuilder local_658;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImage local_488;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  LogImageSet local_3a8;
  MessageBuilder local_368;
  undefined1 local_1e4 [8];
  Vec4 color;
  int x;
  int y;
  Vec4 threshold;
  Vec4 black;
  MessageBuilder local_1a0;
  ConstPixelBufferAccess *local_20;
  ConstPixelBufferAccess *image_local;
  TestLog *log_local;
  
  local_20 = image;
  image_local = (ConstPixelBufferAccess *)log;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [22])"Expecting empty image");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(threshold.m_data + 2),0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.02);
  color.m_data[3] = 0.0;
  do {
    fVar1 = color.m_data[3];
    iVar3 = tcu::ConstPixelBufferAccess::getHeight(image);
    if (iVar3 <= (int)fVar1) {
      tcu::TestLog::operator<<
                (&local_658,(TestLog *)image_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_658,(char (*) [15])"Image is valid");
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_658);
      return true;
    }
    for (color.m_data[2] = 0.0; fVar1 = color.m_data[2],
        iVar3 = tcu::ConstPixelBufferAccess::getWidth(image), (int)fVar1 < iVar3;
        color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_1e4,(int)image,(int)color.m_data[2],
                 (int)color.m_data[3]);
      bVar2 = compareColors((Vec4 *)local_1e4,(Vec4 *)(threshold.m_data + 2),(Vec4 *)&x);
      if (!bVar2) {
        tcu::TestLog::operator<<
                  (&local_368,(TestLog *)image_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_368,(char (*) [35])"Found (at least) one bad pixel at ");
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)(color.m_data + 2));
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x1362a23);
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)(color.m_data + 3));
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [39])". Pixel color is not background color.");
        pTVar5 = tcu::MessageBuilder::operator<<
                           (pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3c8,"LayerContent",&local_3c9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"Layer content",&local_3f1);
        tcu::LogImageSet::LogImageSet(&local_3a8,&local_3c8,&local_3f0);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_3a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"Layer",&local_4a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"Layer",&local_4d1);
        tcu::LogImage::LogImage
                  (&local_488,&local_4a8,&local_4d0,image,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar5 = tcu::TestLog::operator<<(pTVar5,&local_488);
        tcu::TestLog::operator<<(pTVar5,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
        tcu::LogImage::~LogImage(&local_488);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::allocator<char>::~allocator(&local_4d1);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator(&local_4a9);
        tcu::LogImageSet::~LogImageSet(&local_3a8);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator(&local_3c9);
        tcu::MessageBuilder::~MessageBuilder(&local_368);
        return false;
      }
    }
    color.m_data[3] = (float)((int)color.m_data[3] + 1);
  } while( true );
}

Assistant:

bool verifyEmptyImage (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image)
{
	log << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	const Vec4	black		(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	threshold	(0.02f);

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4 color = image.getPixel(x, y);

		if (!compareColors(color, black, threshold))
		{
			log	<< tcu::TestLog::Message
				<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
				<< tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
				<< tcu::TestLog::Image("Layer", "Layer", image)
				<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	log << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}